

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_maddsums_h(DisasContext_conflict14 *ctx,TCGv_i32 ret_low,TCGv_i32 ret_high,TCGv_i32 r1_low,
                   TCGv_i32 r1_high,TCGv_i32 r2,TCGv_i32 r3,uint32_t n,uint32_t mode)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 arg5;
  TCGv_i64 retval;
  TCGv_i64 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 arg11_3;
  TCGv_i32 arg01_3;
  TCGv_i32 arg00_3;
  TCGv_i32 arg11_2;
  TCGv_i32 arg10_1;
  TCGv_i32 arg01_2;
  TCGv_i32 arg00_2;
  TCGv_i32 arg11_1;
  TCGv_i32 arg10;
  TCGv_i32 arg01_1;
  TCGv_i32 arg00_1;
  TCGv_i32 arg11;
  TCGv_i32 arg01;
  TCGv_i32 arg00;
  TCGv_i64 temp64_2;
  TCGv_i64 temp64;
  TCGv_i32 temp;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 r2_local;
  TCGv_i32 r1_high_local;
  TCGv_i32 r1_low_local;
  TCGv_i32 ret_high_local;
  TCGv_i32 ret_low_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg5 = tcg_const_i32_tricore(tcg_ctx_00,n);
  retval = tcg_temp_new_i64(tcg_ctx_00);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  switch(mode) {
  case 0:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar2,r2,0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar3,r2);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar4,r3);
    gen_helper_mul_h(tcg_ctx_00,retval,pTVar2,pTVar3,pTVar4,pTVar4,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    break;
  case 1:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar2,r2,0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar3,r2);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar1,r3,0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar4,r3);
    gen_helper_mul_h(tcg_ctx_00,retval,pTVar2,pTVar3,pTVar4,pTVar1,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case 2:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar2,r2,0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar3,r2);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar4,r3,0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar1,r3);
    gen_helper_mul_h(tcg_ctx_00,retval,pTVar2,pTVar3,pTVar4,pTVar1,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case 3:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar3,r2,0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar2,r2);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar4,r3,0x10);
    gen_helper_mul_h(tcg_ctx_00,retval,pTVar2,pTVar3,pTVar4,pTVar4,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
  }
  tcg_gen_sari_i64_tricore(tcg_ctx_00,ret,retval,0x20);
  tcg_gen_ext32s_i64_tricore(tcg_ctx_00,retval,retval);
  tcg_gen_sub_i64(tcg_ctx_00,retval,ret,retval);
  tcg_gen_shli_i64_tricore(tcg_ctx_00,retval,retval,0x10);
  tcg_gen_concat_i32_i64_tricore(tcg_ctx_00,ret,r1_low,r1_high);
  gen_helper_add64_ssov(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,ret,retval);
  tcg_gen_extr_i64_i32_tricore(tcg_ctx_00,ret_low,ret_high,retval);
  tcg_temp_free_i32(tcg_ctx_00,arg5);
  tcg_temp_free_i64(tcg_ctx_00,retval);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static inline void
gen_maddsums_h(DisasContext *ctx, TCGv ret_low, TCGv ret_high, TCGv r1_low, TCGv r1_high, TCGv r2,
               TCGv r3, uint32_t n, uint32_t mode)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_const_i32(tcg_ctx, n);
    TCGv_i64 temp64 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 temp64_2 = tcg_temp_new_i64(tcg_ctx);

    switch (mode) {
    case MODE_LL:
        GEN_HELPER_LL(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    case MODE_LU:
        GEN_HELPER_LU(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    case MODE_UL:
        GEN_HELPER_UL(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    case MODE_UU:
        GEN_HELPER_UU(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    }
    tcg_gen_sari_i64(tcg_ctx, temp64_2, temp64, 32); /* high */
    tcg_gen_ext32s_i64(tcg_ctx, temp64, temp64); /* low */
    tcg_gen_sub_i64(tcg_ctx, temp64, temp64_2, temp64);
    tcg_gen_shli_i64(tcg_ctx, temp64, temp64, 16);
    tcg_gen_concat_i32_i64(tcg_ctx, temp64_2, r1_low, r1_high);

    gen_helper_add64_ssov(tcg_ctx, temp64, tcg_ctx->cpu_env, temp64_2, temp64);
    tcg_gen_extr_i64_i32(tcg_ctx, ret_low, ret_high, temp64);

    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free_i64(tcg_ctx, temp64);
    tcg_temp_free_i64(tcg_ctx, temp64_2);
}